

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_mov_pc_npc(DisasContext_conflict8 *dc)

{
  TCGContext_conflict8 *tcg_ctx_00;
  TCGv_i64 v1;
  TCGv_i64 v2;
  TCGv_i64 c2;
  target_ulong tVar1;
  uintptr_t o_1;
  uintptr_t o_2;
  TCGContext_conflict8 *tcg_ctx;
  uintptr_t o;
  
  tVar1 = dc->npc;
  tcg_ctx_00 = dc->uc->tcg_ctx;
  if (tVar1 != 1) {
    if (tVar1 != 2) goto LAB_00a41e5b;
    v1 = tcg_const_i64_sparc64(tcg_ctx_00,dc->jump_pc[0]);
    v2 = tcg_const_i64_sparc64(tcg_ctx_00,dc->jump_pc[1]);
    c2 = tcg_const_i64_sparc64(tcg_ctx_00,0);
    tcg_gen_movcond_i64_sparc64
              (tcg_ctx_00,TCG_COND_NE,tcg_ctx_00->cpu_npc,tcg_ctx_00->cpu_cond,c2,v1,v2);
    tcg_temp_free_internal_sparc64(tcg_ctx_00,(TCGTemp *)(v1 + (long)tcg_ctx_00));
    tcg_temp_free_internal_sparc64(tcg_ctx_00,(TCGTemp *)(v2 + (long)tcg_ctx_00));
    tcg_temp_free_internal_sparc64(tcg_ctx_00,(TCGTemp *)(c2 + (long)tcg_ctx_00));
  }
  if (tcg_ctx_00->cpu_pc != tcg_ctx_00->cpu_npc) {
    tcg_gen_op2_sparc64(tcg_ctx_00,INDEX_op_mov_i64,(TCGArg)(tcg_ctx_00->cpu_pc + (long)tcg_ctx_00),
                        (TCGArg)(tcg_ctx_00->cpu_npc + (long)tcg_ctx_00));
  }
  tVar1 = 1;
LAB_00a41e5b:
  dc->pc = tVar1;
  return;
}

Assistant:

static inline void gen_mov_pc_npc(DisasContext *dc)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    if (dc->npc == JUMP_PC) {
        gen_generic_branch(dc);
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_pc, tcg_ctx->cpu_npc);
        dc->pc = DYNAMIC_PC;
    } else if (dc->npc == DYNAMIC_PC) {
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_pc, tcg_ctx->cpu_npc);
        dc->pc = DYNAMIC_PC;
    } else {
        dc->pc = dc->npc;
    }
}